

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

void stbiw__write3(stbi__write_context *s,uchar a,uchar b,uchar c)

{
  int iVar1;
  
  if (0x40 < s->buf_used + 3U) {
    (*s->func)(s->context,s->buffer,s->buf_used);
    s->buf_used = 0;
  }
  iVar1 = s->buf_used;
  s->buf_used = iVar1 + 3;
  s->buffer[iVar1] = a;
  s->buffer[(long)iVar1 + 1] = b;
  s->buffer[(long)iVar1 + 2] = c;
  return;
}

Assistant:

static void stbiw__write3(stbi__write_context *s, unsigned char a, unsigned char b, unsigned char c)
{
   int n;
   if (s->buf_used + 3 > sizeof(s->buffer))
      stbiw__write_flush(s);
   n = s->buf_used;
   s->buf_used = n+3;
   s->buffer[n+0] = a;
   s->buffer[n+1] = b;
   s->buffer[n+2] = c;
}